

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

Ref<anurbs::BrepFace> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>::add
          (PythonDataType<anurbs::Model,_anurbs::BrepFace> *this,Model *self,
          Pointer<anurbs::BrepFace> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepFace> RVar1;
  shared_ptr<anurbs::BrepFace> local_30;
  Pointer<anurbs::BrepFace> *local_20;
  Pointer<anurbs::BrepFace> *data_local;
  Model *self_local;
  
  local_20 = data;
  data_local = (Pointer<anurbs::BrepFace> *)self;
  self_local = (Model *)this;
  std::shared_ptr<anurbs::BrepFace>::shared_ptr(&local_30,data);
  Model::add<anurbs::BrepFace>((Model *)this,(Pointer<anurbs::BrepFace> *)self);
  std::shared_ptr<anurbs::BrepFace>::~shared_ptr(&local_30);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepFace>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add(TModel& self, Pointer<TData> data)
    {
        return self.template add<TData>(data);
    }